

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaReadAig.c
# Opt level: O3

Vec_Int_t * Ioa_WriteDecodeLiterals(char **ppPos,int nEntries)

{
  uint Entry;
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  uint uVar4;
  
  p = (Vec_Int_t *)malloc(0x10);
  uVar4 = nEntries - 1;
  iVar3 = 0x10;
  if (0xe < uVar4) {
    iVar3 = nEntries;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar2;
  Entry = Ioa_ReadAigerDecode(ppPos);
  Vec_IntPush(p,Entry);
  if (1 < nEntries) {
    do {
      uVar1 = Ioa_ReadAigerDecode(ppPos);
      iVar3 = -((int)uVar1 >> 1);
      if ((uVar1 & 1) == 0) {
        iVar3 = (int)uVar1 >> 1;
      }
      Entry = Entry + iVar3;
      Vec_IntPush(p,Entry);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return p;
}

Assistant:

Vec_Int_t * Ioa_WriteDecodeLiterals( char ** ppPos, int nEntries )
{
    Vec_Int_t * vLits;
    int Lit, LitPrev, Diff, i;
    vLits = Vec_IntAlloc( nEntries );
    LitPrev = Ioa_ReadAigerDecode( ppPos );
    Vec_IntPush( vLits, LitPrev );
    for ( i = 1; i < nEntries; i++ )
    {
//        Diff = Lit - LitPrev;
//        Diff = (Lit < LitPrev)? -Diff : Diff;
//        Diff = ((2 * Diff) << 1) | (int)(Lit < LitPrev);
        Diff = Ioa_ReadAigerDecode( ppPos );
        Diff = (Diff & 1)? -(Diff >> 1) : Diff >> 1;
        Lit  = Diff + LitPrev;
        Vec_IntPush( vLits, Lit );
        LitPrev = Lit;
    }
    return vLits;
}